

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void args(char *name)

{
  ostream *poVar1;
  size_t sVar2;
  long *plVar3;
  
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  std::ostream::put('H');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"RetroShare crawler",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage:",6);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\t",1);
  if (name == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x158648);
  }
  else {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,name,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," -f <0 or 1> (first run?) ",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  std::ostream::put('H');
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"NB: The -f Flag set is Required to Run",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  std::ostream::put('H');
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void args(char *name) {
    std::cerr << std::endl << "RetroShare crawler" << std::endl;
    std::cerr << "Usage:" << std::endl;
    std::cerr << "\t" << name << " -f <0 or 1> (first run?) " << std::endl << std::endl;
    std::cerr << "NB: The -f Flag set is Required to Run" << std::endl << std::endl;
}